

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyPaletted<cBGRA,bModulate>
               (BYTE *buffer,BYTE *patch,int srcwidth,int srcheight,int Pitch,int step_x,int step_y,
               int rotate,PalEntry *palette,FCopyInfo *inf)

{
  byte bVar1;
  BYTE BVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  
  if (srcwidth < 1) {
    srcwidth = 0;
  }
  uVar3 = (ulong)(uint)srcheight;
  if (srcheight < 1) {
    uVar3 = 0;
  }
  iVar5 = 0;
  for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
    lVar6 = (long)iVar5;
    pbVar7 = patch;
    for (uVar4 = 0; (uint)srcwidth != uVar4; uVar4 = uVar4 + 1) {
      bVar1 = *pbVar7;
      BVar2 = palette[bVar1].field_0.field_0.a;
      if (BVar2 != '\0') {
        buffer[uVar4 * 4 + lVar6 + 2] =
             (BYTE)(((uint)buffer[uVar4 * 4 + lVar6 + 2] * (uint)palette[bVar1].field_0.field_0.r) /
                   0xff);
        buffer[uVar4 * 4 + lVar6 + 1] =
             (BYTE)(((uint)buffer[uVar4 * 4 + lVar6 + 1] * (uint)palette[bVar1].field_0.field_0.g) /
                   0xff);
        buffer[uVar4 * 4 + lVar6] =
             (BYTE)(((uint)buffer[uVar4 * 4 + lVar6] * (uint)palette[bVar1].field_0.field_0.b) /
                   0xff);
        buffer[uVar4 * 4 + lVar6 + 3] = BVar2;
      }
      pbVar7 = pbVar7 + step_x;
    }
    iVar5 = iVar5 + Pitch;
    patch = patch + step_y;
  }
  return;
}

Assistant:

void iCopyPaletted(BYTE *buffer, const BYTE * patch, int srcwidth, int srcheight, int Pitch,
					int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	int x,y,pos;

	for (y=0;y<srcheight;y++)
	{
		pos = y*Pitch;
		for (x=0;x<srcwidth;x++,pos+=4)
		{
			int v=(unsigned char)patch[y*step_y+x*step_x];
			int a = palette[v].a;

			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(buffer[pos + TDest::RED], palette[v].r, a, inf);
				TBlend::OpC(buffer[pos + TDest::GREEN], palette[v].g, a, inf);
				TBlend::OpC(buffer[pos + TDest::BLUE], palette[v].b, a, inf);
				TBlend::OpA(buffer[pos + TDest::ALPHA], a, inf);
			}
		}
	}
}